

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  attributeDeclSAXFunc p_Var2;
  xmlParserErrors error;
  xmlChar *str;
  int iVar3;
  uint uVar4;
  int iVar5;
  xmlType xVar6;
  xmlChar *pxVar7;
  xmlChar *name2;
  void *pvVar8;
  xmlHashTablePtr pxVar9;
  xmlChar *pxVar10;
  int *userdata;
  xmlParserInputPtr pxVar11;
  long lVar12;
  char *pcVar13;
  int local_5c;
  xmlEnumerationPtr tree;
  xmlChar *local_50;
  int local_44;
  xmlChar *local_40;
  xmlChar *defaultValue;
  
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar11 = ctxt->input;
    pxVar7 = pxVar11->cur;
    if (*pxVar7 != '!') {
      return;
    }
    if (pxVar7[1] != 'A') {
      return;
    }
    if (pxVar7[2] != 'T') {
      return;
    }
    if (pxVar7[3] != 'T') {
      return;
    }
    if (pxVar7[4] != 'L') {
      return;
    }
    if (pxVar7[5] != 'I') {
      return;
    }
    if (pxVar7[6] != 'S') {
      return;
    }
    if (pxVar7[7] != 'T') {
      return;
    }
    lVar12 = 8;
    iVar3 = 8;
  }
  else {
    if (ctxt->mlType != XML_TYPE_XML) {
      return;
    }
    pxVar11 = ctxt->input;
    pxVar7 = pxVar11->cur;
    if (*pxVar7 != '<') {
      return;
    }
    if (pxVar7[1] != '!') {
      return;
    }
    if (pxVar7[2] != 'A') {
      return;
    }
    if (pxVar7[3] != 'T') {
      return;
    }
    if (pxVar7[4] != 'T') {
      return;
    }
    if (pxVar7[5] != 'L') {
      return;
    }
    if (pxVar7[6] != 'I') {
      return;
    }
    if (pxVar7[7] != 'S') {
      return;
    }
    if (pxVar7[8] != 'T') {
      return;
    }
    lVar12 = 9;
    iVar3 = 9;
  }
  local_44 = pxVar11->id;
  pxVar11->cur = pxVar7 + lVar12;
  pxVar11->col = pxVar11->col + iVar3;
  if (pxVar7[lVar12] == '\0') {
    xmlParserInputGrow(pxVar11,0xfa);
  }
  iVar3 = xmlSkipBlankChars(ctxt);
  if (iVar3 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'<!ATTLIST\'\n");
  }
  pxVar7 = xmlParseName(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"ATTLIST: no name for Element\n");
    return;
  }
  xmlSkipBlankChars(ctxt);
  local_50 = pxVar7;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  while( true ) {
    xVar6 = ctxt->mlType;
    if (xVar6 == XML_TYPE_SML) {
      xVar1 = *ctxt->input->cur;
      if ((xVar1 == '\n') || (xVar1 == ';')) goto LAB_0015f5b0;
    }
    else if ((xVar6 == XML_TYPE_XML) && (*ctxt->input->cur == '>')) goto LAB_0015f5a1;
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015f597;
    defaultValue = (xmlChar *)0x0;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    tree = (xmlEnumerationPtr)0x0;
    name2 = xmlParseName(ctxt);
    if (name2 == (xmlChar *)0x0) break;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 == 0) {
      pcVar13 = "Space required after the attribute name\n";
      error = XML_ERR_SPACE_REQUIRED;
      goto LAB_0015f540;
    }
    uVar4 = xmlParseAttributeType(ctxt,&tree);
    if ((int)uVar4 < 1) goto LAB_0015f591;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the attribute type\n");
      goto LAB_0015f582;
    }
    iVar3 = xmlParseDefaultDecl(ctxt,&defaultValue);
    str = defaultValue;
    if (defaultValue != (xmlChar *)0x0 && uVar4 != 1) {
      xmlAttrNormalizeSpace(defaultValue,defaultValue);
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->mlType == XML_TYPE_SML) {
      xVar1 = *ctxt->input->cur;
      if ((xVar1 != '\n') && (xVar1 != ';')) goto LAB_0015f1d7;
    }
    else if ((ctxt->mlType != XML_TYPE_XML) || (*ctxt->input->cur != '>')) {
LAB_0015f1d7:
      iVar5 = xmlSkipBlankChars(ctxt);
      if (iVar5 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,
                       "Space required after the attribute default value\n");
        if (str != (xmlChar *)0x0) {
          (*xmlFree)(str);
        }
LAB_0015f582:
        if (tree != (xmlEnumerationPtr)0x0) {
          xmlFreeEnumeration(tree);
        }
LAB_0015f591:
        xVar6 = ctxt->mlType;
LAB_0015f597:
        if (xVar6 == XML_TYPE_SML) {
LAB_0015f5b0:
          pxVar11 = ctxt->input;
          if ((*pxVar11->cur != ';') && (*pxVar11->cur != '\n')) {
            return;
          }
        }
        else {
          if (xVar6 != XML_TYPE_XML) {
            return;
          }
LAB_0015f5a1:
          pxVar11 = ctxt->input;
          if (*pxVar11->cur != '>') {
            return;
          }
        }
        if (local_44 != pxVar11->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Attribute list declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar(ctxt);
        return;
      }
    }
    if (((ctxt->sax == (_xmlSAXHandler *)0x0) || (ctxt->disableSAX != 0)) ||
       (p_Var2 = ctxt->sax->attributeDecl, p_Var2 == (attributeDeclSAXFunc)0x0)) {
      if (tree != (xmlEnumerationPtr)0x0) {
        xmlFreeEnumeration(tree);
      }
    }
    else {
      (*p_Var2)(ctxt->userData,pxVar7,name2,uVar4,iVar3,str,tree);
    }
    iVar5 = ctxt->sax2;
    if (iVar3 - 4U < 0xfffffffe && (iVar5 != 0 && str != (xmlChar *)0x0)) {
      if ((ctxt->attsSpecial == (xmlHashTablePtr)0x0) ||
         (pvVar8 = xmlHashLookup2(ctxt->attsSpecial,pxVar7,name2), pvVar8 == (void *)0x0)) {
        if (ctxt->attsDefault == (xmlHashTablePtr)0x0) {
          pxVar9 = xmlHashCreateDict(10,ctxt->dict);
          ctxt->attsDefault = pxVar9;
          if (pxVar9 != (xmlHashTablePtr)0x0) goto LAB_0015f2a1;
        }
        else {
LAB_0015f2a1:
          pxVar7 = local_50;
          pxVar10 = xmlSplitQName3(local_50,&local_5c);
          if (pxVar10 == (xmlChar *)0x0) {
            pxVar10 = xmlDictLookup(ctxt->dict,pxVar7,-1);
            pxVar7 = (xmlChar *)0x0;
          }
          else {
            pxVar10 = xmlDictLookup(ctxt->dict,pxVar10,-1);
            pxVar7 = xmlDictLookup(ctxt->dict,pxVar7,local_5c);
          }
          local_40 = pxVar10;
          userdata = (int *)xmlHashLookup2(ctxt->attsDefault,pxVar10,pxVar7);
          if (userdata == (int *)0x0) {
            userdata = (int *)(*xmlMalloc)(0xa8);
            if (userdata != (int *)0x0) {
              userdata[0] = 0;
              userdata[1] = 4;
LAB_0015f36a:
              iVar3 = xmlHashUpdateEntry2(ctxt->attsDefault,local_40,pxVar7,userdata,
                                          (xmlHashDeallocator)0x0);
              if (-1 < iVar3) goto LAB_0015f38c;
              (*xmlFree)(userdata);
            }
          }
          else {
            if (*userdata < userdata[1]) {
LAB_0015f38c:
              pxVar7 = xmlSplitQName3(name2,&local_5c);
              if (pxVar7 == (xmlChar *)0x0) {
                pxVar7 = xmlDictLookup(ctxt->dict,name2,-1);
                pxVar10 = (xmlChar *)0x0;
              }
              else {
                pxVar7 = xmlDictLookup(ctxt->dict,pxVar7,-1);
                pxVar10 = xmlDictLookup(ctxt->dict,name2,local_5c);
              }
              iVar3 = *userdata;
              *(xmlChar **)(userdata + (long)iVar3 * 10 + 2) = pxVar7;
              *(xmlChar **)(userdata + (long)(iVar3 * 5) * 2 + 4) = pxVar10;
              local_5c = xmlStrlen(str);
              pxVar7 = xmlDictLookup(ctxt->dict,str,local_5c);
              iVar3 = *userdata;
              *(xmlChar **)(userdata + (long)iVar3 * 10 + 6) = pxVar7;
              *(xmlChar **)(userdata + (long)(iVar3 * 5) * 2 + 8) = pxVar7 + local_5c;
              pcVar13 = "external";
              if (ctxt->external == 0) {
                pcVar13 = (char *)0x0;
              }
              *(char **)(userdata + (long)(iVar3 * 5) * 2 + 10) = pcVar13;
              *userdata = iVar3 + 1;
              pxVar7 = local_50;
              goto LAB_0015f464;
            }
            userdata = (int *)(*xmlRealloc)(userdata,(long)userdata[1] * 0x50 | 8);
            if (userdata != (int *)0x0) {
              userdata[1] = userdata[1] << 1;
              goto LAB_0015f36a;
            }
          }
        }
        xmlErrMemory(ctxt,(char *)0x0);
        pxVar7 = local_50;
      }
LAB_0015f464:
      iVar5 = ctxt->sax2;
    }
    if (iVar5 != 0) {
      pxVar9 = ctxt->attsSpecial;
      if (pxVar9 == (xmlHashTablePtr)0x0) {
        pxVar9 = xmlHashCreateDict(10,ctxt->dict);
        ctxt->attsSpecial = pxVar9;
        if (pxVar9 == (xmlHashTablePtr)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          goto LAB_0015f4c8;
        }
      }
      pvVar8 = xmlHashLookup2(pxVar9,pxVar7,name2);
      if (pvVar8 == (void *)0x0) {
        xmlHashAddEntry2(ctxt->attsSpecial,pxVar7,name2,(void *)(ulong)uVar4);
      }
    }
LAB_0015f4c8:
    if (str != (xmlChar *)0x0) {
      (*xmlFree)(str);
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  }
  pcVar13 = "ATTLIST: no name for Attribute\n";
  error = XML_ERR_NAME_REQUIRED;
LAB_0015f540:
  xmlFatalErrMsg(ctxt,error,pcVar13);
  goto LAB_0015f591;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    DEBUG_ENTER(("xmlParseAttributeListDecl(%s);\n", dbgCtxt(ctxt)));

    if (CMP9_MLI(CUR_PTR, '<', '!', 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP_MLI(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    RETURN();
	}
	SKIP_BLANKS;
	GROW;
	while ((!RAW_IS_GT_MLI) && (ctxt->instate != XML_PARSER_EOF)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (!RAW_IS_GT_MLI) { /* RAW != '>' */
		if (SKIP_BLANKS == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW_IS_GT_MLI) { /* RAW == '>' */
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
    RETURN();
}